

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O2

int stbtt_PackFontRangesGatherRects
              (stbtt_pack_context *spc,stbtt_fontinfo *info,stbtt_pack_range *ranges,int num_ranges,
              stbrp_rect *rects)

{
  uint uVar1;
  uint uVar2;
  stbtt_fontinfo *font;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  int *piVar7;
  float fVar8;
  int local_50;
  int local_4c;
  int x0;
  int y0;
  int x1;
  int y1;
  int local_34;
  
  uVar4 = 0;
  uVar5 = (ulong)(uint)num_ranges;
  if (num_ranges < 1) {
    uVar5 = uVar4;
  }
  local_34 = 0;
  _x1 = info;
  for (; uVar4 != uVar5; uVar4 = uVar4 + 1) {
    fVar8 = ranges[uVar4].font_size;
    if (fVar8 <= 0.0) {
      fVar8 = -fVar8 / (float)(ushort)(*(ushort *)(_x1->data + (long)_x1->head + 0x12) << 8 |
                                      *(ushort *)(_x1->data + (long)_x1->head + 0x12) >> 8);
    }
    else {
      fVar8 = stbtt_ScaleForPixelHeight(_x1,fVar8);
    }
    ranges[uVar4].h_oversample = (uchar)spc->h_oversample;
    ranges[uVar4].v_oversample = (uchar)spc->v_oversample;
    piVar7 = &rects[local_34].h;
    for (lVar6 = 0; font = _x1, lVar6 < ranges[uVar4].num_chars; lVar6 = lVar6 + 1) {
      if (ranges[uVar4].array_of_unicode_codepoints == (int *)0x0) {
        iVar3 = ranges[uVar4].first_unicode_codepoint_in_range + (int)lVar6;
      }
      else {
        iVar3 = ranges[uVar4].array_of_unicode_codepoints[lVar6];
      }
      iVar3 = stbtt_FindGlyphIndex(_x1,iVar3);
      uVar1 = spc->h_oversample;
      uVar2 = spc->v_oversample;
      stbtt_GetGlyphBitmapBoxSubpixel
                (font,iVar3,(float)uVar1 * fVar8,(float)uVar2 * fVar8,0.0,0.0,&local_50,&local_4c,
                 &x0,&y0);
      iVar3 = spc->padding;
      piVar7[-1] = (iVar3 + uVar1 + -1 + x0) - local_50;
      *piVar7 = (iVar3 + uVar2 + -1 + y0) - local_4c;
      piVar7 = piVar7 + 6;
    }
    local_34 = local_34 + (int)lVar6;
  }
  return local_34;
}

Assistant:

STBTT_DEF int stbtt_PackFontRangesGatherRects(stbtt_pack_context *spc, stbtt_fontinfo *info, stbtt_pack_range *ranges, int num_ranges, stbrp_rect *rects)
{
   int i,j,k;

   k=0;
   for (i=0; i < num_ranges; ++i) {
      float fh = ranges[i].font_size;
      float scale = fh > 0 ? stbtt_ScaleForPixelHeight(info, fh) : stbtt_ScaleForMappingEmToPixels(info, -fh);
      ranges[i].h_oversample = (unsigned char) spc->h_oversample;
      ranges[i].v_oversample = (unsigned char) spc->v_oversample;
      for (j=0; j < ranges[i].num_chars; ++j) {
         int x0,y0,x1,y1;
         int codepoint = ranges[i].array_of_unicode_codepoints == NULL ? ranges[i].first_unicode_codepoint_in_range + j : ranges[i].array_of_unicode_codepoints[j];
         int glyph = stbtt_FindGlyphIndex(info, codepoint);
         stbtt_GetGlyphBitmapBoxSubpixel(info,glyph,
                                         scale * spc->h_oversample,
                                         scale * spc->v_oversample,
                                         0,0,
                                         &x0,&y0,&x1,&y1);
         rects[k].w = (stbrp_coord) (x1-x0 + spc->padding + spc->h_oversample-1);
         rects[k].h = (stbrp_coord) (y1-y0 + spc->padding + spc->v_oversample-1);
         ++k;
      }
   }

   return k;
}